

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall
tinygltf::TinyGLTF::LoadBinaryFromFile
          (TinyGLTF *this,Model *model,string *err,string *warn,string *filename,uint check_sections
          )

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  string *warn_00;
  string *err_00;
  string *model_00;
  bool bVar1;
  ostream *poVar2;
  reference bytes;
  size_type sVar3;
  undefined1 local_280 [7];
  bool ret;
  string basedir;
  undefined1 local_238 [7];
  bool fileread;
  string fileerr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string local_1f8 [48];
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [380];
  uint local_3c;
  string *psStack_38;
  uint check_sections_local;
  string *filename_local;
  string *warn_local;
  string *err_local;
  Model *model_local;
  TinyGLTF *this_local;
  
  local_3c = check_sections;
  psStack_38 = filename;
  filename_local = warn;
  warn_local = err;
  err_local = (string *)model;
  model_local = (Model *)this;
  std::__cxx11::stringstream::stringstream(local_1c8);
  if ((this->fs).ReadWholeFile == (ReadWholeFileFunction)0x0) {
    poVar2 = std::operator<<(local_1b8,"Failed to read file: ");
    poVar2 = std::operator<<(poVar2,(string *)psStack_38);
    poVar2 = std::operator<<(poVar2,": one or more FS callback not set");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if (warn_local != (string *)0x0) {
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=((string *)warn_local,local_1f8);
      std::__cxx11::string::~string(local_1f8);
    }
    this_local._7_1_ = 0;
  }
  else {
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&fileerr.field_2 + 8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this_00);
    std::__cxx11::string::string((string *)local_238);
    bVar1 = (*(this->fs).ReadWholeFile)(this_00,(string *)local_238,psStack_38,(this->fs).user_data)
    ;
    if (bVar1) {
      GetBaseDir((string *)local_280,psStack_38);
      model_00 = err_local;
      err_00 = warn_local;
      warn_00 = filename_local;
      bytes = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)&fileerr.field_2 + 8),0);
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)&fileerr.field_2 + 8));
      this_local._7_1_ =
           LoadBinaryFromMemory
                     (this,(Model *)model_00,err_00,warn_00,bytes,(uint)sVar3,(string *)local_280,
                      local_3c);
      std::__cxx11::string::~string((string *)local_280);
    }
    else {
      poVar2 = std::operator<<(local_1b8,"Failed to read file: ");
      poVar2 = std::operator<<(poVar2,(string *)psStack_38);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,(string *)local_238);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      if (warn_local != (string *)0x0) {
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator=
                  ((string *)warn_local,(string *)(basedir.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(basedir.field_2._M_local_buf + 8));
      }
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_238);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&fileerr.field_2 + 8)
              );
  }
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TinyGLTF::LoadBinaryFromFile(Model *model, std::string *err,
                                  std::string *warn,
                                  const std::string &filename,
                                  unsigned int check_sections) {
  std::stringstream ss;

  if (fs.ReadWholeFile == nullptr) {
    // Programmer error, assert() ?
    ss << "Failed to read file: " << filename
       << ": one or more FS callback not set" << std::endl;
    if (err) {
      (*err) = ss.str();
    }
    return false;
  }

  std::vector<unsigned char> data;
  std::string fileerr;
  bool fileread = fs.ReadWholeFile(&data, &fileerr, filename, fs.user_data);
  if (!fileread) {
    ss << "Failed to read file: " << filename << ": " << fileerr << std::endl;
    if (err) {
      (*err) = ss.str();
    }
    return false;
  }

  std::string basedir = GetBaseDir(filename);

  bool ret = LoadBinaryFromMemory(model, err, warn, &data.at(0),
                                  static_cast<unsigned int>(data.size()),
                                  basedir, check_sections);

  return ret;
}